

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O2

int run_test_get_currentexe(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStackY_2060;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  size_t size;
  char buffer [4096];
  char path [4096];
  
  iVar1 = uv_exepath(buffer);
  if (iVar1 != 0) {
    pcVar2 = "!r";
    uVar6 = 0x32;
LAB_0013fd48:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
            ,uVar6,pcVar2);
    abort();
  }
  pcVar2 = realpath(executable_path,path);
  if (pcVar2 == (char *)0x0) {
    uStackY_2060 = 0x37;
    pcVar3 = "realpath(executable_path, path)";
    eval_b = 0;
    pcVar5 = "!=";
    eval_a = 0;
    pcVar4 = "NULL";
    pcVar2 = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
  }
  else {
    pcVar2 = strstr(buffer,path);
    if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,path), iVar1 != 0)) {
      pcVar2 = "match && !strcmp(match, path)";
      uVar6 = 0x3e;
      goto LAB_0013fd48;
    }
    eval_a = 0x1000;
    eval_b = strlen(buffer);
    if (eval_b == 0x1000) {
      iVar1 = uv_exepath(0);
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        iVar1 = uv_exepath(buffer,0);
        eval_a = (int64_t)iVar1;
        eval_b = -0x16;
        if (eval_a == -0x16) {
          iVar1 = uv_exepath(buffer);
          eval_a = (int64_t)iVar1;
          eval_b = -0x16;
          if (eval_a == -0x16) {
            memset(buffer,0xff,0x1000);
            iVar1 = uv_exepath(buffer);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = 0;
              pcVar4 = "0";
              pcVar3 = "size";
              uStackY_2060 = 0x52;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uStackY_2060 = 0x51;
            }
          }
          else {
            pcVar4 = "UV_EINVAL";
            pcVar3 = "r";
            uStackY_2060 = 0x4b;
          }
        }
        else {
          pcVar4 = "UV_EINVAL";
          pcVar3 = "r";
          uStackY_2060 = 0x47;
        }
      }
      else {
        pcVar4 = "UV_EINVAL";
        pcVar3 = "r";
        uStackY_2060 = 0x44;
      }
    }
    else {
      pcVar4 = "strlen(buffer)";
      pcVar3 = "size";
      uStackY_2060 = 0x3f;
    }
    pcVar5 = "==";
    pcVar2 = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  fprintf(_stderr,pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-currentexe.c"
          ,uStackY_2060,pcVar3,pcVar5,pcVar4,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif

  char buffer[PATHMAX];
  char path[PATHMAX];
  size_t size;
  char* match;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

#ifdef _WIN32
  snprintf(path, sizeof(path), "%s", executable_path);
#else
  ASSERT_NOT_NULL(realpath(executable_path, path));
#endif

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT_EQ(size, strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT_EQ(r, UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_OK(size);
  ASSERT_EQ(buffer[0], '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);
  ASSERT_EQ(1, size);
  ASSERT_NE(buffer[0], '\0');
  ASSERT_EQ(buffer[1], '\0');

  /* Verify uv_exepath is not affected by uv_set_process_title(). */
  r = uv_set_process_title("foobar");
  ASSERT_OK(r);
  size = sizeof(buffer);
  r = uv_exepath(buffer, &size);
  ASSERT_OK(r);

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT_NOT_NULL(match);
  ASSERT_STR_EQ(match, path);
  ASSERT_EQ(size, strlen(buffer));
  return 0;
}